

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_std_file_close(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  FILE *__stream;
  int iVar1;
  undefined8 *puVar2;
  ulong uVar3;
  ulong uVar4;
  JSValue JVar6;
  int64_t iVar5;
  
  puVar2 = (undefined8 *)JS_GetOpaque2(ctx,this_val,js_std_file_class_id);
  if (puVar2 == (undefined8 *)0x0) {
    iVar5 = 6;
    uVar3 = 0;
    uVar4 = 0;
  }
  else {
    __stream = (FILE *)*puVar2;
    if (__stream == (FILE *)0x0) {
      JVar6 = JS_ThrowTypeError(ctx,"invalid file handle");
      iVar5 = JVar6.tag;
      uVar4 = (ulong)JVar6.u.ptr & 0xffffffff00000000;
      uVar3 = (ulong)JVar6.u._0_4_;
    }
    else {
      if (*(int *)((long)puVar2 + 0xc) == 0) {
        iVar1 = fclose(__stream);
      }
      else {
        iVar1 = pclose(__stream);
      }
      uVar3 = js_get_errno((long)iVar1);
      *puVar2 = 0;
      uVar3 = uVar3 & 0xffffffff;
      uVar4 = 0;
      iVar5 = 0;
    }
  }
  JVar6.u.ptr = (void *)(uVar3 | uVar4);
  JVar6.tag = iVar5;
  return JVar6;
}

Assistant:

static JSValue js_std_file_close(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv)
{
    JSSTDFile *s = JS_GetOpaque2(ctx, this_val, js_std_file_class_id);
    int err;
    if (!s)
        return JS_EXCEPTION;
    if (!s->f)
        return JS_ThrowTypeError(ctx, "invalid file handle");
    if (s->is_popen)
        err = js_get_errno(pclose(s->f));
    else
        err = js_get_errno(fclose(s->f));
    s->f = NULL;
    return JS_NewInt32(ctx, err);
}